

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxas.cpp
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> *
nxas::assemble(vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
              string *code,char *filename)

{
  bool bVar1;
  ulong uVar2;
  uint *puVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  span<const_unsigned_long,_18446744073709551615UL> code_00;
  uint64_t sched;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_150;
  vector<unsigned_long,_std::allocator<unsigned_long>_> blob;
  vector<opcode,_std::allocator<opcode>_> opcodes;
  context ctx;
  
  local_150 = __return_storage_ptr__;
  context::context(&ctx,filename,(code->_M_dataplus)._M_p);
  opcodes.super__Vector_base<opcode,_std::allocator<opcode>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = 0x3b;
  uVar2 = std::ranges::__count_fn::
          operator()<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char,_std::identity>
                    ((__count_fn *)&std::ranges::count,code);
  std::vector<opcode,_std::allocator<opcode>_>::vector(&opcodes,uVar2 + 1,(allocator_type *)&blob);
  uVar6 = 0xffffffffffffffff;
  lVar8 = 0;
  do {
    bVar1 = parse_instruction(&ctx,(opcode *)
                                   (CONCAT71(opcodes.
                                             super__Vector_base<opcode,_std::allocator<opcode>_>.
                                             _M_impl.super__Vector_impl_data._M_start._1_7_,
                                             opcodes.
                                             super__Vector_base<opcode,_std::allocator<opcode>_>.
                                             _M_impl.super__Vector_impl_data._M_start._0_1_) + lVar8
                                   ));
    uVar6 = uVar6 + 1;
    lVar8 = lVar8 + 0x10;
  } while (bVar1);
  if (uVar2 == uVar6) {
    blob.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    blob.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    blob.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              (&blob,((uVar2 + 1) * 4) / 3 + 4);
    lVar8 = 0xc;
    for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
      if (uVar6 % 3 == 0) {
        sched = 0;
        puVar3 = (uint *)(CONCAT71(opcodes.super__Vector_base<opcode,_std::allocator<opcode>_>.
                                   _M_impl.super__Vector_impl_data._M_start._1_7_,
                                   opcodes.super__Vector_base<opcode,_std::allocator<opcode>_>.
                                   _M_impl.super__Vector_impl_data._M_start._0_1_) + lVar8);
        uVar5 = uVar6;
        for (lVar4 = 0; lVar4 != 0x3f; lVar4 = lVar4 + 0x15) {
          uVar7 = 0x7e0;
          if (uVar5 < uVar2) {
            uVar7 = (ulong)puVar3[-1] << 0x11 | (ulong)*puVar3;
          }
          sched = sched | uVar7 << ((byte)lVar4 & 0x3f);
          puVar3 = puVar3 + 4;
          uVar5 = uVar5 + 1;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&blob,&sched);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&blob,(value_type_conflict *)
                       (uVar6 * 0x10 +
                       CONCAT71(opcodes.super__Vector_base<opcode,_std::allocator<opcode>_>._M_impl.
                                super__Vector_impl_data._M_start._1_7_,
                                opcodes.super__Vector_base<opcode,_std::allocator<opcode>_>._M_impl.
                                super__Vector_impl_data._M_start._0_1_)));
      lVar8 = lVar8 + 0x10;
    }
    while( true ) {
      if (((long)blob.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)blob.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start & 0x18U) == 0) break;
      sched = 0x50b0000000070f00;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&blob,&sched);
    }
    code_00._M_extent._M_extent_value =
         (long)blob.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)blob.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start >> 3;
    code_00._M_ptr =
         blob.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    context::binary(local_150,&ctx,code_00);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&blob.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<opcode,_std::allocator<opcode>_>::~_Vector_base
              (&opcodes.super__Vector_base<opcode,_std::allocator<opcode>_>);
    context::~context(&ctx);
    return local_150;
  }
  __assert_fail("index == max_decode_instructions",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ReinUsesLisp[P]nxas/src/nxas.cpp"
                ,0x28,"std::vector<uint64_t> nxas::assemble(const std::string &, const char *)");
}

Assistant:

std::vector<uint64_t> assemble(const std::string& code, const char* filename)
{
    // Prepare our context
    context ctx(filename, code.c_str());

    // To determine the number of instructions to allocate we count the number of semicolons this
    // is possible because every instruction ends with a semicolon on the number of decoding
    // instructions we allocate one extra because one instruction might be bugged and it won't have
    // a semicolon (which will trigger a fatal)
    const size_t max_decode_instructions = std::ranges::count(code, ';') + 1;
    std::vector<opcode> opcodes(max_decode_instructions);

    size_t index = 0;
    while (parse_instruction(ctx, opcodes[index++])) {
    }
    assert(index == max_decode_instructions);
    const size_t num_instructions = index - 1;

    std::vector<uint64_t> blob;
    blob.reserve(max_decode_instructions * 4 / 3 + 4);
    for (index = 0; index < num_instructions; ++index) {
        if (index % 3 == 0) {
            uint64_t sched = 0;
            for (size_t address = 0; address < 3; ++address) {
                sched |= generate_sched(opcodes, index, num_instructions, address);
            }
            blob.push_back(sched);
        }
        blob.push_back(opcodes[index].value);
    }
    while (blob.size() % 4) {
        blob.push_back(0x50B0000000070F00ULL);
    }
    return ctx.binary(blob);
}